

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O1

void gen_mtvscr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  if (ctx->altivec_enabled != false) {
    s = ctx->uc->tcg_ctx;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i32,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 7 & 0x1f0) + 0x12d20);
    local_28 = (TCGTemp *)(s->cpu_env + (long)s);
    local_20 = ts;
    tcg_gen_callN_ppc64(s,helper_mtvscr_ppc64,(TCGTemp *)0x0,2,&local_28);
    tcg_temp_free_internal_ppc64(s,ts);
    return;
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void gen_mtvscr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 val;
    int bofs;

    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }

    val = tcg_temp_new_i32(tcg_ctx);
    bofs = avr_full_offset(rB(ctx->opcode));
#ifdef HOST_WORDS_BIGENDIAN
    bofs += 3 * 4;
#endif

    tcg_gen_ld_i32(tcg_ctx, val, tcg_ctx->cpu_env, bofs);
    gen_helper_mtvscr(tcg_ctx, tcg_ctx->cpu_env, val);
    tcg_temp_free_i32(tcg_ctx, val);
}